

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserSamTest_ParseInChunks_Test::~BioparserSamTest_ParseInChunks_Test
          (BioparserSamTest_ParseInChunks_Test *this)

{
  BioparserSamTest::~BioparserSamTest(&this->super_BioparserSamTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserSamTest, ParseInChunks) {
  Setup("sample.sam");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}